

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O2

void __thiscall cmRST::OutputMarkupLines(cmRST *this,bool inlineMarkup)

{
  pointer pbVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> line;
  string local_d0;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  pbVar1 = (this->MarkupLines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (this->MarkupLines).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    std::__cxx11::string::string((string *)&local_d0,(string *)pbVar2);
    if (local_d0._M_string_length != 0) {
      local_80.View_._M_len = 1;
      local_80.View_._M_str = " ";
      local_b0.View_._M_len = local_d0._M_string_length;
      local_b0.View_._M_str = local_d0._M_dataplus._M_p;
      cmStrCat<>(&local_50,&local_80,&local_b0);
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    OutputLine(this,&local_d0,inlineMarkup);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  this->OutputLinePending = true;
  return;
}

Assistant:

void cmRST::OutputMarkupLines(bool inlineMarkup)
{
  for (auto line : this->MarkupLines) {
    if (!line.empty()) {
      line = cmStrCat(" ", line);
    }
    this->OutputLine(line, inlineMarkup);
  }
  this->OutputLinePending = true;
}